

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::CalcTiltedLighting
          (DrawTiltedSpanPalCommand *this,double lval,double lend,int width,DrawerThread *thread)

{
  uint8_t *puVar1;
  long lVar2;
  uint8_t **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint8_t *in_RCX;
  uint uVar9;
  double dVar10;
  double dVar11;
  
  if ((width == 0) || (lval == lend)) {
    if (24.0 <= lval) {
      lval = 24.0;
    }
    uVar9 = this->planeshade - SUB84(lval + 103079215104.0,0) >> 0x10;
    uVar6 = 0x1f;
    if ((int)uVar9 < 0x1f) {
      uVar6 = uVar9;
    }
    uVar9 = 0;
    if ((int)uVar6 < 1) {
      uVar6 = uVar9;
    }
    uVar5 = (ulong)(uVar6 << 8);
  }
  else {
    dVar10 = (lend - lval) / (double)width;
    if (24.0 <= lval) {
      dVar11 = 24.0;
      if (lval <= 24.0) {
        dVar11 = lval;
      }
      iVar8 = this->planeshade - SUB84(dVar11 + 103079215104.0,0) >> 0x10;
      iVar7 = 0x1f;
      if (iVar8 < 0x1f) {
        iVar7 = iVar8;
      }
      uVar5 = 0;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      in_RCX = this->basecolormapdata + (uint)(iVar7 << 8);
      if ((-1 < width) && (24.0 <= lval)) {
        uVar4 = 0;
        do {
          thread->tiltlighting[uVar4] = in_RCX;
          lval = lval + dVar10;
          uVar5 = uVar4 + 1;
          if ((uint)width <= uVar4) break;
          uVar4 = uVar5;
        } while (24.0 <= lval);
      }
    }
    else {
      uVar5 = 0;
    }
    uVar9 = (uint)uVar5;
    if (24.0 <= lend) {
      dVar11 = 24.0;
      if (lend <= 24.0) {
        dVar11 = lend;
      }
      iVar8 = this->planeshade - SUB84(dVar11 + 103079215104.0,0) >> 0x10;
      iVar7 = 0x1f;
      if (iVar8 < 0x1f) {
        iVar7 = iVar8;
      }
      iVar8 = 0;
      if (0 < iVar7) {
        iVar8 = iVar7;
      }
      in_RCX = this->basecolormapdata + (uint)(iVar8 << 8);
      if (((int)uVar9 < width) && (24.0 <= lend)) {
        lVar2 = (long)width;
        do {
          thread->tiltlighting[lVar2] = in_RCX;
          lend = lend - dVar10;
          width = width - 1;
          if (lVar2 + -1 <= (long)(int)uVar9) break;
          lVar2 = lVar2 + -1;
        } while (24.0 <= lend);
      }
    }
    if (width < 1) goto LAB_002db611;
    dVar11 = (double)this->planeshade * 1.52587890625e-05 - lval;
    dVar10 = (lval - lend) / (double)width;
    if (dVar10 < 0.0) {
      if (1.0 <= dVar11) {
        if (32.0 <= dVar11) {
          if ((int)uVar9 <= width && 32.0 <= dVar11) {
            puVar1 = this->basecolormapdata;
            ppuVar3 = thread->tiltlighting + (uVar5 & 0xffffffff);
            do {
              *ppuVar3 = puVar1 + 0x1f00;
              dVar11 = dVar11 + dVar10;
              iVar7 = (int)uVar5;
              uVar9 = iVar7 + 1;
              if (dVar11 < 32.0) break;
              ppuVar3 = ppuVar3 + 1;
              uVar5 = (ulong)uVar9;
            } while (iVar7 < width);
          }
          uVar5 = (ulong)uVar9;
          if (width < (int)uVar9) {
            return;
          }
        }
        if (((int)uVar5 <= width) && (0.0 <= dVar11)) {
          uVar4 = (long)(int)uVar5;
          do {
            thread->tiltlighting[uVar4] =
                 this->basecolormapdata + (SUB84(dVar11 + 6755399441055744.0,0) << 8);
            uVar5 = uVar4 + 1;
            if ((long)(ulong)(uint)width <= (long)uVar4) break;
            dVar11 = dVar11 + dVar10;
            uVar4 = uVar5;
          } while (0.0 <= dVar11);
        }
      }
      uVar9 = (uint)uVar5;
      in_RCX = this->basecolormapdata;
      goto LAB_002db611;
    }
    if (dVar11 < 31.0) {
      if ((int)uVar9 <= width && dVar11 < 0.0) {
        ppuVar3 = thread->tiltlighting + (uVar5 & 0xffffffff);
        do {
          *ppuVar3 = this->basecolormapdata;
          dVar11 = dVar11 + dVar10;
          iVar7 = (int)uVar5;
          uVar9 = iVar7 + 1;
          if (0.0 <= dVar11) break;
          ppuVar3 = ppuVar3 + 1;
          uVar5 = (ulong)uVar9;
        } while (iVar7 < width);
      }
      if (width < (int)uVar9) {
        return;
      }
      if (dVar11 < 31.0) {
        ppuVar3 = thread->tiltlighting + uVar9;
        uVar6 = uVar9;
        do {
          *ppuVar3 = this->basecolormapdata + (SUB84(dVar11 + 6755399441055744.0,0) << 8);
          uVar9 = uVar6 + 1;
          if (width <= (int)uVar6) break;
          dVar11 = dVar11 + dVar10;
          ppuVar3 = ppuVar3 + 1;
          uVar6 = uVar9;
        } while (dVar11 < 31.0);
      }
      in_RCX = this->basecolormapdata + 0x1f00;
      goto LAB_002db611;
    }
    uVar5 = 0x1f00;
  }
  in_RCX = this->basecolormapdata + uVar5;
LAB_002db611:
  if ((int)uVar9 <= width) {
    lVar2 = 0;
    do {
      thread->tiltlighting[(int)uVar9 + lVar2] = in_RCX;
      lVar2 = lVar2 + 1;
    } while ((width - uVar9) + 1 != (int)lVar2);
  }
  return;
}

Assistant:

void DrawTiltedSpanPalCommand::CalcTiltedLighting(double lval, double lend, int width, DrawerThread *thread)
	{
		const uint8_t **tiltlighting = thread->tiltlighting;

		double lstep;
		uint8_t *lightfiller;
		int i = 0;

		if (width == 0 || lval == lend)
		{ // Constant lighting
			lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
		}
		else
		{
			lstep = (lend - lval) / width;
			if (lval >= MAXLIGHTVIS)
			{ // lval starts "too bright".
				lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
				for (; i <= width && lval >= MAXLIGHTVIS; ++i)
				{
					tiltlighting[i] = lightfiller;
					lval += lstep;
				}
			}
			if (lend >= MAXLIGHTVIS)
			{ // lend ends "too bright".
				lightfiller = basecolormapdata + (GETPALOOKUP(lend, planeshade) << COLORMAPSHIFT);
				for (; width > i && lend >= MAXLIGHTVIS; --width)
				{
					tiltlighting[width] = lightfiller;
					lend -= lstep;
				}
			}
			if (width > 0)
			{
				lval = FIXED2DBL(planeshade) - lval;
				lend = FIXED2DBL(planeshade) - lend;
				lstep = (lend - lval) / width;
				if (lstep < 0)
				{ // Going from dark to light
					if (lval < 1.)
					{ // All bright
						lightfiller = basecolormapdata;
					}
					else
					{
						if (lval >= NUMCOLORMAPS)
						{ // Starts beyond the dark end
							uint8_t *clight = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
							while (lval >= NUMCOLORMAPS && i <= width)
							{
								tiltlighting[i++] = clight;
								lval += lstep;
							}
							if (i > width)
								return;
						}
						while (i <= width && lval >= 0)
						{
							tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
							lval += lstep;
						}
						lightfiller = basecolormapdata;
					}
				}
				else
				{ // Going from light to dark
					if (lval >= (NUMCOLORMAPS - 1))
					{ // All dark
						lightfiller = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
					}
					else
					{
						while (lval < 0 && i <= width)
						{
							tiltlighting[i++] = basecolormapdata;
							lval += lstep;
						}
						if (i > width)
							return;
						while (i <= width && lval < (NUMCOLORMAPS - 1))
						{
							tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
							lval += lstep;
						}
						lightfiller = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
					}
				}
			}
		}
		for (; i <= width; i++)
		{
			tiltlighting[i] = lightfiller;
		}
	}